

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_41304e::RNGState::AddEvent(RNGState *this,uint32_t event_info)

{
  long in_FS_OFFSET;
  AnnotatedMixin<std::mutex> *unaff_retaddr;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_00000008;
  uint32_t perfcounter;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock0;
  Mutex *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  uchar *in_stack_fffffffffffffff0;
  CSHA256 *this_00;
  
  this_00 = *(CSHA256 **)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld(in_stack_ffffffffffffffc8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_00000008,unaff_retaddr,(char *)this_00,(char *)in_stack_fffffffffffffff0,
             in_stack_ffffffffffffffec,SUB41((uint)in_stack_ffffffffffffffe8 >> 0x18,0));
  CSHA256::Write(this_00,in_stack_fffffffffffffff0,
                 CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  GetPerformanceCounter();
  CSHA256::Write(this_00,in_stack_fffffffffffffff0,
                 CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffffc8);
  if (*(CSHA256 **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_events_mutex)
    {
        LOCK(m_events_mutex);

        m_events_hasher.Write((const unsigned char *)&event_info, sizeof(event_info));
        // Get the low four bytes of the performance counter. This translates to roughly the
        // subsecond part.
        uint32_t perfcounter = (GetPerformanceCounter() & 0xffffffff);
        m_events_hasher.Write((const unsigned char*)&perfcounter, sizeof(perfcounter));
    }